

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase *
EvaluateGenericFunctionPrototype
          (ExpressionEvalContext *ctx,ExprGenericFunctionPrototype *expression)

{
  bool bVar1;
  StackFrame **ppSVar2;
  ExprBase *pEVar3;
  ExprVariableDefinition *local_28;
  ExprBase *expr;
  ExprGenericFunctionPrototype *expression_local;
  ExpressionEvalContext *ctx_local;
  
  bVar1 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::empty(&ctx->stackFrames);
  if ((!bVar1) &&
     (ppSVar2 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames),
     (*ppSVar2)->targetYield != 0)) {
    pEVar3 = &ExpressionContext::get<ExprVoid>(ctx->ctx)->super_ExprBase;
    ExprVoid::ExprVoid((ExprVoid *)pEVar3,(expression->super_ExprBase).source,ctx->ctx->typeVoid);
    return pEVar3;
  }
  bVar1 = AddInstruction(ctx);
  if (bVar1) {
    for (local_28 = (expression->contextVariables).head; local_28 != (ExprVariableDefinition *)0x0;
        local_28 = (ExprVariableDefinition *)(local_28->super_ExprBase).next) {
      pEVar3 = Evaluate(ctx,&local_28->super_ExprBase);
      if (pEVar3 == (ExprBase *)0x0) {
        return (ExprBase *)0x0;
      }
    }
    ctx_local = (ExpressionEvalContext *)ExpressionContext::get<ExprVoid>(ctx->ctx);
    ExprVoid::ExprVoid((ExprVoid *)ctx_local,(expression->super_ExprBase).source,ctx->ctx->typeVoid)
    ;
  }
  else {
    ctx_local = (ExpressionEvalContext *)0x0;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* EvaluateGenericFunctionPrototype(ExpressionEvalContext &ctx, ExprGenericFunctionPrototype *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	for(ExprBase *expr = expression->contextVariables.head; expr; expr = expr->next)
	{
		if(!Evaluate(ctx, expr))
			return NULL;
	}

	return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);
}